

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O0

uint anon_unknown.dwarf_472314::countMipmaps(int w,int h,int d)

{
  int *piVar1;
  uint *puVar2;
  bool bVar3;
  int local_30 [3];
  int local_24;
  int local_20 [4];
  uint mipmap;
  int d_local;
  int h_local;
  int w_local;
  
  local_20[2] = 0;
  local_20[3] = d;
  mipmap = h;
  d_local = w;
  while( true ) {
    bVar3 = true;
    if ((d_local == 1) && (bVar3 = true, mipmap == 1)) {
      bVar3 = local_20[3] != 1;
    }
    if (!bVar3) break;
    local_20[1] = 1;
    local_20[0] = d_local / 2;
    piVar1 = nv::max<int>(local_20 + 1,local_20);
    d_local = *piVar1;
    local_24 = 1;
    local_30[2] = (int)mipmap / 2;
    puVar2 = (uint *)nv::max<int>(&local_24,local_30 + 2);
    mipmap = *puVar2;
    local_30[1] = 1;
    local_30[0] = local_20[3] / 2;
    piVar1 = nv::max<int>(local_30 + 1,local_30);
    local_20[3] = *piVar1;
    local_20[2] = local_20[2] + 1;
  }
  return local_20[2] + 1;
}

Assistant:

static uint countMipmaps(int w, int h, int d)
	{
		uint mipmap = 0;
		
		while (w != 1 || h != 1 || d != 1) {
			w = max(1, w / 2);
			h = max(1, h / 2);
			d = max(1, d / 2);
			mipmap++;
		}
		
		return mipmap + 1;
	}